

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

double * cheby_t_poly_coef(int n)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  
  if (n < 0) {
    return (double *)0x0;
  }
  uVar9 = (ulong)(uint)n;
  uVar1 = uVar9 + 1;
  pdVar2 = (double *)operator_new__((ulong)(uint)((n + 1) * (n + 1)) << 3);
  uVar3 = 0;
  uVar4 = uVar1;
  pdVar5 = pdVar2;
  pdVar8 = pdVar2;
  do {
    do {
      *pdVar5 = 0.0;
      uVar4 = uVar4 - 1;
      pdVar5 = pdVar5 + uVar9 + 1;
    } while (uVar4 != 0);
    uVar3 = uVar3 + 1;
    pdVar5 = pdVar8 + 1;
    uVar4 = uVar1;
    pdVar8 = pdVar5;
  } while (uVar3 != uVar1);
  *pdVar2 = 1.0;
  if ((n != 0) && (pdVar2[uVar9 + 2] = 1.0, 1 < n)) {
    uVar4 = uVar1 & 0xffffffff;
    uVar3 = 2;
    lVar6 = 0;
    pdVar5 = pdVar2;
    do {
      pdVar5 = pdVar5 + 1;
      pdVar2[uVar3] = -pdVar2[uVar3 - 2];
      lVar7 = lVar6;
      pdVar8 = pdVar5;
      if (2 < uVar3) {
        do {
          pdVar8[uVar4 + 1] = (*pdVar8 + *pdVar8) - pdVar8[uVar4 - 1];
          lVar7 = lVar7 + -1;
          pdVar8 = pdVar8 + uVar4;
        } while (lVar7 != 0);
      }
      pdVar2[uVar3 + (long)(((int)uVar3 + -1) * (int)uVar1)] =
           pdVar2[uVar3 + (uVar3 - 2) * uVar4 + -1] + pdVar2[uVar3 + (uVar3 - 2) * uVar4 + -1];
      pdVar2[(n + 2) * (int)uVar3] =
           pdVar2[(uVar3 - 1) * (uVar4 + 1)] + pdVar2[(uVar3 - 1) * (uVar4 + 1)];
      uVar3 = uVar3 + 1;
      lVar6 = lVar6 + 1;
    } while (uVar3 != uVar1);
  }
  return pdVar2;
}

Assistant:

double *cheby_t_poly_coef ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_T_POLY_COEF evaluates coefficients of Chebyshev polynomials T(n,x).
//
//  First terms:
//
//    N/K     0     1      2      3       4     5      6    7      8    9   10
//
//     0      1
//     1      0     1
//     2     -1     0      2
//     3      0    -3      0      4
//     4      1     0     -8      0       8
//     5      0     5      0    -20       0    16
//     6     -1     0     18      0     -48     0     32
//     7      0    -7      0     56       0  -112      0    64
//
//  Recursion:
//
//    T(0,X) = 1,
//    T(1,X) = X,
//    T(N,X) = 2 * X * T(N-1,X) - T(N-2,X)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    22 April 2012
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double CHEBY_T_POLY_COEF[(N+1)*(N+1)], the coefficients of 
//    the Chebyshev T polynomials.
//
{
  double *c;
  int i;
  int j;

  if ( n < 0 )
  {
    return NULL;
  }

  c = new double[(n+1)*(n+1)];

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n == 0 )
  {
    return c;
  }

  c[1+1*(n+1)] = 1.0;

  for ( i = 2; i <= n; i++ )
  {
    c[i+0*(n+1)]     =                    - c[i-2+0*(n+1)];
    for ( j = 1; j <= i - 2; j++ )
    {
      c[i+j*(n+1)] = 2.0 * c[i-1+(j-1)*(n+1)] - c[i-2+j*(n+1)];
    }
    c[i+(i-1)*(n+1)] = 2.0 * c[i-1+(i-2)*(n+1)];
    c[i+ i   *(n+1)] = 2.0 * c[i-1+(i-1)*(n+1)];
  }

  return c;
}